

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

void TPZTensor<TFad<6,_double>_>::TPZDecomposed::TangentCheckConv
               (TPZFMatrix<double> *state,TPZFMatrix<double> *tangent,int icase)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  double *pdVar5;
  long lVar6;
  ostream *poVar7;
  int i_1;
  long lVar8;
  int i;
  long lVar9;
  int i_2;
  TPZTensor<double> obj;
  TPZDecomposed objdec;
  double local_308;
  TPZTensor<double> local_2e8;
  TPZDecomposed local_290;
  
  local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  lVar9 = 0;
  TPZVec<double>::TPZVec(&local_2e8.fData.super_TPZVec<double>,0);
  local_2e8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01877af0;
  local_2e8.fData.super_TPZVec<double>.fStore = local_2e8.fData.fExtAlloc;
  local_2e8.fData.super_TPZVec<double>.fNElements = 6;
  local_2e8.fData.super_TPZVec<double>.fNAlloc = 0;
  local_2e8.fData.fExtAlloc[0] = 0.0;
  local_2e8.fData.fExtAlloc[1] = 0.0;
  local_2e8.fData.fExtAlloc[2] = 0.0;
  local_2e8.fData.fExtAlloc[3] = 0.0;
  local_2e8.fData.fExtAlloc[4] = 0.0;
  local_2e8.fData.fExtAlloc[5] = 0.0;
  pdVar4 = state->fElem;
  do {
    local_2e8.fData.fExtAlloc[lVar9] = pdVar4[lVar9];
    lVar9 = lVar9 + 1;
  } while (lVar9 != 6);
  TPZTensor<double>::TPZDecomposed::TPZDecomposed(&local_290,&local_2e8);
  if ((uint)icase < 3) {
    (*(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
              (tangent,1,9);
    lVar9 = 0;
    do {
      gEigval[lVar9] = local_290.fEigenvalues.super_TPZVec<double>.fStore[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    lVar9 = (tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    lVar8 = 0;
    do {
      pdVar4 = local_290.fEigentensors.super_TPZVec<TPZTensor<double>_>.fStore[(uint)icase].fData.
               super_TPZVec<double>.fStore;
      if ((lVar9 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5 = tangent->fElem;
      pdVar5[lVar9 * lVar8] = pdVar4[lVar8];
      if ((lVar9 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 7)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5[lVar9 * 6] = pdVar4[1];
      if ((lVar9 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5[lVar9 * 7] = pdVar4[2];
      if ((lVar9 < 1) || ((tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 9)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      pdVar5[lVar9 * 8] = pdVar4[4];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 6);
    local_308 = 0.0;
    lVar8 = 0;
    do {
      lVar6 = (tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
      if (lVar6 <= lVar8 || lVar9 < 1) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((lVar9 < 1) || (lVar6 <= lVar8)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_308 = local_308 + pdVar5[lVar9 * lVar8] * pdVar5[lVar9 * lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 9);
    lVar8 = (tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    if (lVar8 < 1 || lVar9 < 1) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar1 = *pdVar5;
    if (lVar8 < 4 || lVar9 < 1) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar2 = pdVar5[lVar9 * 3];
    if ((lVar9 < 1) || (lVar8 < 6)) {
      TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    dVar3 = pdVar5[lVar9 * 5];
    (*(tangent->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x1c]
    )(tangent,"tangent",&std::cout,0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sum2 = ",7);
    poVar7 = std::ostream::_M_insert<double>(dVar1 + dVar2 + dVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"sum = ",6);
    poVar7 = std::ostream::_M_insert<double>(local_308);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  TPZManVector<TPZTensor<double>,_3>::~TPZManVector(&local_290.fEigentensors);
  TPZManVector<TPZManVector<double,_3>,_3>::~TPZManVector(&local_290.fEigenvectors);
  TPZManVector<double,_3>::~TPZManVector(&local_290.fEigenvalues);
  if (local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore !=
      local_290.fGeometricMultiplicity.fExtAlloc) {
    local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fNAlloc = 0;
    local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>._vptr_TPZVec =
         (_func_int **)&PTR__TPZVec_01877960;
    if (local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore != (uint *)0x0) {
      operator_delete__(local_290.fGeometricMultiplicity.super_TPZVec<unsigned_int>.fStore);
    }
  }
  local_2e8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZTensor_01877730;
  if (local_2e8.fData.super_TPZVec<double>.fStore != local_2e8.fData.fExtAlloc) {
    local_2e8.fData.super_TPZVec<double>.fNAlloc = 0;
    local_2e8.fData.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
    if (local_2e8.fData.super_TPZVec<double>.fStore != (double *)0x0) {
      operator_delete__(local_2e8.fData.super_TPZVec<double>.fStore);
    }
  }
  return;
}

Assistant:

static void TangentCheckConv(TPZFMatrix<STATE> &state, TPZFMatrix<STATE> &tangent, int icase) {
            TPZTensor<STATE> obj;
            for (int i = 0; i < 6; i++) {
                obj[i] = state(i);
            }
            TPZTensor<STATE>::TPZDecomposed objdec(obj);
            switch (icase) {
                case 0:
                case 1:
                case 2:
                {
                    tangent.Resize(1, 9);
                    for (int i = 0; i < 3; i++) {
                        gEigval[i] = objdec.fEigenvalues[i];
                    }
                    for (int j = 0; j < 6; j++) {
                        tangent(0, j) = objdec.fEigentensors[icase][j];
                        tangent(0, 6) = objdec.fEigentensors[icase].XY();
                        tangent(0, 7) = objdec.fEigentensors[icase].XZ();
                        tangent(0, 8) = objdec.fEigentensors[icase].YZ();
                    }
                    STATE sum = 0., sum2 = 0.;
                    for (int i = 0; i < 9; i++) {
                        sum += tangent(0, i) * tangent(0, i);
                    }
                    sum2 = tangent(0, _XX_) + tangent(0, _YY_) + tangent(0, _ZZ_);
                    tangent.Print("tangent");
                    std::cout << "sum2 = " << sum2 << std::endl;
                    std::cout << "sum = " << sum << std::endl;
                }
                    break;
                default:
                    break;
            }
        }